

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O2

ZIPentry * zip_load_entry(ZIPinfo *info,int zip64,PHYSFS_uint64 ofs_fixup)

{
  size_t sVar1;
  PHYSFS_Io *io;
  _func_PHYSFS_sint64_PHYSFS_Io_ptr *p_Var2;
  _func_int_PHYSFS_Io_ptr_PHYSFS_uint64 *p_Var3;
  undefined8 uVar4;
  size_t __n;
  int iVar5;
  char *path;
  ZIPentry *pZVar6;
  ZipResolveType ZVar7;
  PHYSFS_uint64 PVar8;
  undefined1 *puVar9;
  undefined8 *puVar10;
  undefined1 *ptr;
  ushort uVar11;
  PHYSFS_uint16 PVar12;
  undefined1 auStack_118 [8];
  undefined1 local_110 [8];
  PHYSFS_uint64 offset;
  int local_100;
  int local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  long local_e8;
  char *pcStack_e0;
  undefined8 uStack_d8;
  ZIPentry entry;
  uint local_58;
  int local_54;
  PHYSFS_uint32 external_attr;
  PHYSFS_uint16 local_4c;
  PHYSFS_uint16 local_4a;
  PHYSFS_uint16 fnamelen;
  PHYSFS_uint16 commentlen;
  PHYSFS_uint16 ui16;
  PHYSFS_uint16 local_3c;
  PHYSFS_uint16 local_3a;
  uint local_38;
  PHYSFS_uint16 sig;
  ushort local_32;
  PHYSFS_uint32 ui32;
  
  puVar9 = auStack_118;
  io = info->io;
  iVar5 = readui32(io,&local_38);
  if (iVar5 == 0) {
    return (ZIPentry *)0x0;
  }
  if (local_38 == 0x2014b50) {
    entry.uncompressed_size = 0;
    entry.last_mod_time = 0;
    entry.crc = 0;
    entry._76_4_ = 0;
    entry.compressed_size = 0;
    entry.offset = 0;
    entry.version = 0;
    entry.version_needed = 0;
    entry.general_bits = 0;
    entry.compression_method = 0;
    entry.symlink = (_ZIPentry *)0x0;
    entry.resolved = ZIP_UNRESOLVED_FILE;
    entry._52_4_ = 0;
    entry.tree.sibling = (__PHYSFS_DirTreeEntry *)0x0;
    entry.tree.isdir = 0;
    entry.tree._36_4_ = 0;
    entry.tree.hashnext = (__PHYSFS_DirTreeEntry *)0x0;
    entry.tree.children = (__PHYSFS_DirTreeEntry *)0x0;
    uStack_d8 = 0;
    entry.tree.name = (char *)0x0;
    iVar5 = readui16(io,(PHYSFS_uint16 *)&entry.offset);
    if (iVar5 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar5 = readui16(io,(PHYSFS_uint16 *)((long)&entry.offset + 2));
    if (iVar5 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar5 = readui16(io,(PHYSFS_uint16 *)((long)&entry.offset + 4));
    if (iVar5 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar5 = readui16(io,(PHYSFS_uint16 *)((long)&entry.offset + 6));
    if (iVar5 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar5 = readui32(io,(PHYSFS_uint32 *)&entry.last_mod_time);
    if (iVar5 == 0) {
      return (ZIPentry *)0x0;
    }
    local_f8._0_4_ = 0;
    local_f8._4_4_ = 0;
    local_e8 = 0;
    pcStack_e0 = (char *)0x0;
    local_fc = ((uint)entry.last_mod_time >> 0x19) + 0x50;
    local_100 = ((uint)entry.last_mod_time >> 0x15 & 0xf) - 1;
    offset._4_4_ = (uint)entry.last_mod_time >> 0x10 & 0x1f;
    offset._0_4_ = (uint)entry.last_mod_time >> 0xb & 0x1f;
    local_110 = (undefined1  [8])
                (CONCAT44((uint)entry.last_mod_time >> 5,(uint)entry.last_mod_time * 2) &
                0x3f0000003e);
    uStack_f0._0_4_ = -1;
    uStack_f0._4_4_ = 0;
    entry.uncompressed_size = mktime((tm *)local_110);
    iVar5 = readui32(io,(PHYSFS_uint32 *)&entry.version);
    if (iVar5 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar5 = readui32(io,&local_38);
    if (iVar5 == 0) {
      return (ZIPentry *)0x0;
    }
    entry._72_8_ = ZEXT48(local_38);
    iVar5 = readui32(io,&local_38);
    if (iVar5 == 0) {
      return (ZIPentry *)0x0;
    }
    entry.compressed_size = (PHYSFS_uint64)local_38;
    iVar5 = readui16(io,(PHYSFS_uint16 *)&external_attr);
    if (iVar5 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar5 = readui16(io,&local_32);
    if (iVar5 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar5 = readui16(io,(PHYSFS_uint16 *)((long)&external_attr + 2));
    if (iVar5 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar5 = readui16(io,&local_4c);
    if (iVar5 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar5 = readui16(io,&local_4c);
    if (iVar5 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar5 = readui32(io,&local_58);
    if (iVar5 == 0) {
      return (ZIPentry *)0x0;
    }
    iVar5 = readui32(io,&local_38);
    if (iVar5 == 0) {
      return (ZIPentry *)0x0;
    }
    local_110 = (undefined1  [8])(ulong)local_38;
    _fnamelen = (PHYSFS_uint64)(ushort)external_attr;
    local_4a = local_4c;
    if (_fnamelen < 0xff) {
      ptr = auStack_118 + -(ulong)((ushort)external_attr + 0x18 & 0xfffffff0);
      puVar9 = ptr;
    }
    else {
      ptr = (undefined1 *)0x0;
      puVar9 = auStack_118;
    }
    sVar1 = _fnamelen + 1;
    *(undefined8 *)(puVar9 + -8) = 0x114d1c;
    path = (char *)__PHYSFS_initSmallAlloc(ptr,sVar1);
    sVar1 = _fnamelen;
    if (path != (char *)0x0) {
      *(undefined8 *)(puVar9 + -8) = 0x114d37;
      iVar5 = __PHYSFS_readAll(io,path,sVar1);
      PVar8 = _fnamelen;
      if (iVar5 == 0) {
        *(undefined8 *)(puVar9 + -8) = 0x114dc9;
        __PHYSFS_smallFree(path);
        return (ZIPentry *)0x0;
      }
      local_54 = 0;
      sig._1_1_ = path[_fnamelen - 1];
      if (path[_fnamelen - 1] == '/') {
        path[_fnamelen - 1] = '\0';
        *(undefined8 *)(puVar9 + -8) = 1;
        local_54 = (int)*(undefined8 *)(puVar9 + -8);
      }
      path[PVar8] = '\0';
      PVar12 = (PHYSFS_uint16)entry.offset;
      *(undefined8 *)(puVar9 + -8) = 0x114d7a;
      zip_convert_dos_path(PVar12,path);
      iVar5 = local_54;
      *(undefined8 *)(puVar9 + -8) = 0x114d88;
      pZVar6 = (ZIPentry *)__PHYSFS_DirTreeAdd(&info->tree,path,iVar5);
      *(undefined8 *)(puVar9 + -8) = 0x114d93;
      __PHYSFS_smallFree(path);
      if (pZVar6 != (ZIPentry *)0x0) {
        if (pZVar6->last_mod_time == 0) {
          *(undefined8 *)(puVar9 + -8) = 0x48;
          __n = *(size_t *)(puVar9 + -8);
          *(undefined8 *)(puVar9 + -8) = 0x114ddf;
          memcpy(&pZVar6->symlink,&entry.tree.isdir,__n);
          pZVar6->symlink = (_ZIPentry *)0x0;
          if (sig._1_1_ == '/') {
            *(undefined8 *)(puVar9 + -8) = 4;
            ZVar7 = (ZipResolveType)*(undefined8 *)(puVar9 + -8);
          }
          else if (((pZVar6->version < 0x1300) &&
                   ((0x4e857U >> (pZVar6->version >> 8 & 0x1f) & 1) != 0)) ||
                  (pZVar6->uncompressed_size == 0)) {
            ZVar7 = ZIP_UNRESOLVED_FILE;
          }
          else {
            ZVar7 = (ZipResolveType)((local_58 & 0xf0000000) == 0xa0000000);
          }
          pZVar6->resolved = ZVar7;
          p_Var2 = io->tell;
          *(undefined8 *)(puVar9 + -8) = 0x114e34;
          _fnamelen = (*p_Var2)(io);
          if (_fnamelen == 0xffffffffffffffff) {
            return (ZIPentry *)0x0;
          }
          if ((zip64 == 0) ||
             (((local_38 != 0xffffffff && (pZVar6->compressed_size != 0xffffffff)) &&
              (pZVar6->uncompressed_size != 0xffffffff)))) {
LAB_00114f56:
            if (local_4a == 0) {
              pZVar6->offset = ofs_fixup + (long)local_110;
              PVar8 = _fnamelen + (ulong)external_attr._2_2_ + (ulong)local_32;
              p_Var3 = io->seek;
              *(undefined8 *)(puVar9 + -8) = 0x114f85;
              iVar5 = (*p_Var3)(io,PVar8);
              if (iVar5 == 0) {
                return (ZIPentry *)0x0;
              }
              return pZVar6;
            }
          }
          else {
            local_3c = 0;
            local_3a = 0;
            uVar11 = local_32;
            while (4 < uVar11) {
              *(undefined8 *)(puVar9 + -8) = 0x114e94;
              iVar5 = readui16(io,&local_3c);
              if (iVar5 == 0) {
                return (ZIPentry *)0x0;
              }
              *(undefined8 *)(puVar9 + -8) = 0x114ea8;
              iVar5 = readui16(io,&local_3a);
              PVar12 = local_3a;
              if (iVar5 == 0) {
                return (ZIPentry *)0x0;
              }
              PVar8 = _fnamelen + local_3a + 4;
              _fnamelen = PVar8;
              uVar11 = uVar11 - (local_3a + 4);
              if (local_3c == 1) {
                local_32 = uVar11;
                if (pZVar6->uncompressed_size == 0xffffffff) {
                  if (local_3a < 8) break;
                  *(undefined8 *)(puVar9 + -8) = 0x114f0f;
                  iVar5 = readui64(io,&pZVar6->uncompressed_size);
                  if (iVar5 == 0) {
                    return (ZIPentry *)0x0;
                  }
                  PVar12 = PVar12 - 8;
                }
                if (pZVar6->compressed_size == 0xffffffff) {
                  if (PVar12 < 8) break;
                  *(undefined8 *)(puVar9 + -8) = 0x114f3a;
                  iVar5 = readui64(io,&pZVar6->compressed_size);
                  if (iVar5 == 0) {
                    return (ZIPentry *)0x0;
                  }
                  PVar12 = PVar12 - 8;
                }
                if (local_38 == 0xffffffff) {
                  if (PVar12 < 8) break;
                  *(undefined8 *)(puVar9 + -8) = 0x114fac;
                  iVar5 = readui64(io,(PHYSFS_uint64 *)local_110);
                  if (iVar5 == 0) {
                    return (ZIPentry *)0x0;
                  }
                  PVar12 = PVar12 - 8;
                }
                if (PVar12 != 0) break;
                goto LAB_00114f56;
              }
              p_Var3 = io->seek;
              *(undefined8 *)(puVar9 + -8) = 0x114edc;
              iVar5 = (*p_Var3)(io,PVar8);
              if (iVar5 == 0) {
                return (ZIPentry *)0x0;
              }
            }
          }
        }
        goto LAB_00114da0;
      }
    }
    puVar10 = (undefined8 *)(puVar9 + -8);
    *(undefined8 *)(puVar9 + -8) = 2;
  }
  else {
LAB_00114da0:
    puVar10 = (undefined8 *)(puVar9 + -8);
    *(undefined8 *)(puVar9 + -8) = 0x12;
  }
  uVar4 = *puVar10;
  *puVar10 = 0x114da8;
  PHYSFS_setErrorCode((PHYSFS_ErrorCode)uVar4);
  return (ZIPentry *)0x0;
}

Assistant:

static ZIPentry *zip_load_entry(ZIPinfo *info, const int zip64,
                                const PHYSFS_uint64 ofs_fixup)
{
    PHYSFS_Io *io = info->io;
    ZIPentry entry;
    ZIPentry *retval = NULL;
    PHYSFS_uint16 fnamelen, extralen, commentlen;
    PHYSFS_uint32 external_attr;
    PHYSFS_uint32 starting_disk;
    PHYSFS_uint64 offset;
    PHYSFS_uint16 ui16;
    PHYSFS_uint32 ui32;
    PHYSFS_sint64 si64;
    char *name = NULL;
    int isdir = 0;

    /* sanity check with central directory signature... */
    BAIL_IF_ERRPASS(!readui32(io, &ui32), NULL);
    BAIL_IF(ui32 != ZIP_CENTRAL_DIR_SIG, PHYSFS_ERR_CORRUPT, NULL);

    memset(&entry, '\0', sizeof (entry));

    /* Get the pertinent parts of the record... */
    BAIL_IF_ERRPASS(!readui16(io, &entry.version), NULL);
    BAIL_IF_ERRPASS(!readui16(io, &entry.version_needed), NULL);
    BAIL_IF_ERRPASS(!readui16(io, &entry.general_bits), NULL);  /* general bits */
    BAIL_IF_ERRPASS(!readui16(io, &entry.compression_method), NULL);
    BAIL_IF_ERRPASS(!readui32(io, &entry.dos_mod_time), NULL);
    entry.last_mod_time = zip_dos_time_to_physfs_time(entry.dos_mod_time);
    BAIL_IF_ERRPASS(!readui32(io, &entry.crc), NULL);
    BAIL_IF_ERRPASS(!readui32(io, &ui32), NULL);
    entry.compressed_size = (PHYSFS_uint64) ui32;
    BAIL_IF_ERRPASS(!readui32(io, &ui32), NULL);
    entry.uncompressed_size = (PHYSFS_uint64) ui32;
    BAIL_IF_ERRPASS(!readui16(io, &fnamelen), NULL);
    BAIL_IF_ERRPASS(!readui16(io, &extralen), NULL);
    BAIL_IF_ERRPASS(!readui16(io, &commentlen), NULL);
    BAIL_IF_ERRPASS(!readui16(io, &ui16), NULL);
    starting_disk = (PHYSFS_uint32) ui16;
    BAIL_IF_ERRPASS(!readui16(io, &ui16), NULL);  /* internal file attribs */
    BAIL_IF_ERRPASS(!readui32(io, &external_attr), NULL);
    BAIL_IF_ERRPASS(!readui32(io, &ui32), NULL);
    offset = (PHYSFS_uint64) ui32;

    name = (char *) __PHYSFS_smallAlloc(fnamelen + 1);
    BAIL_IF(!name, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    if (!__PHYSFS_readAll(io, name, fnamelen))
    {
        __PHYSFS_smallFree(name);
        return NULL;
    } /* if */

    if (name[fnamelen - 1] == '/')
    {
        name[fnamelen - 1] = '\0';
        isdir = 1;
    } /* if */
    name[fnamelen] = '\0';  /* null-terminate the filename. */

    zip_convert_dos_path(entry.version, name);

    retval = (ZIPentry *) __PHYSFS_DirTreeAdd(&info->tree, name, isdir);
    __PHYSFS_smallFree(name);

    BAIL_IF(!retval, PHYSFS_ERR_OUT_OF_MEMORY, NULL);

    /* It's okay to BAIL without freeing retval, because it's stored in the
       __PHYSFS_DirTree and will be freed later anyhow. */
    BAIL_IF(retval->last_mod_time != 0, PHYSFS_ERR_CORRUPT, NULL); /* dupe? */

    /* Move the data we already read into place in the official object. */
    memcpy(((PHYSFS_uint8 *) retval) + sizeof (__PHYSFS_DirTreeEntry),
           ((PHYSFS_uint8 *) &entry) + sizeof (__PHYSFS_DirTreeEntry),
           sizeof (*retval) - sizeof (__PHYSFS_DirTreeEntry));

    retval->symlink = NULL;  /* will be resolved later, if necessary. */

    if (isdir)
        retval->resolved = ZIP_DIRECTORY;
    else
    {
        retval->resolved = (zip_has_symlink_attr(retval, external_attr)) ?
                                ZIP_UNRESOLVED_SYMLINK : ZIP_UNRESOLVED_FILE;
    } /* else */

    si64 = io->tell(io);
    BAIL_IF_ERRPASS(si64 == -1, NULL);

    /* If the actual sizes didn't fit in 32-bits, look for the Zip64
        extended information extra field... */
    if ( (zip64) &&
         ((offset == 0xFFFFFFFF) ||
          (starting_disk == 0xFFFFFFFF) ||
          (retval->compressed_size == 0xFFFFFFFF) ||
          (retval->uncompressed_size == 0xFFFFFFFF)) )
    {
        int found = 0;
        PHYSFS_uint16 sig = 0;
        PHYSFS_uint16 len = 0;
        while (extralen > 4)
        {
            BAIL_IF_ERRPASS(!readui16(io, &sig), NULL);
            BAIL_IF_ERRPASS(!readui16(io, &len), NULL);

            si64 += 4 + len;
            extralen -= 4 + len;
            if (sig != ZIP64_EXTENDED_INFO_EXTRA_FIELD_SIG)
            {
                BAIL_IF_ERRPASS(!io->seek(io, si64), NULL);
                continue;
            } /* if */

            found = 1;
            break;
        } /* while */

        BAIL_IF(!found, PHYSFS_ERR_CORRUPT, NULL);

        if (retval->uncompressed_size == 0xFFFFFFFF)
        {
            BAIL_IF(len < 8, PHYSFS_ERR_CORRUPT, NULL);
            BAIL_IF_ERRPASS(!readui64(io, &retval->uncompressed_size), NULL);
            len -= 8;
        } /* if */

        if (retval->compressed_size == 0xFFFFFFFF)
        {
            BAIL_IF(len < 8, PHYSFS_ERR_CORRUPT, NULL);
            BAIL_IF_ERRPASS(!readui64(io, &retval->compressed_size), NULL);
            len -= 8;
        } /* if */

        if (offset == 0xFFFFFFFF)
        {
            BAIL_IF(len < 8, PHYSFS_ERR_CORRUPT, NULL);
            BAIL_IF_ERRPASS(!readui64(io, &offset), NULL);
            len -= 8;
        } /* if */

        if (starting_disk == 0xFFFFFFFF)
        {
            BAIL_IF(len < 8, PHYSFS_ERR_CORRUPT, NULL);
            BAIL_IF_ERRPASS(!readui32(io, &starting_disk), NULL);
            len -= 4;
        } /* if */

        BAIL_IF(len != 0, PHYSFS_ERR_CORRUPT, NULL);
    } /* if */

    BAIL_IF(starting_disk != 0, PHYSFS_ERR_CORRUPT, NULL);

    retval->offset = offset + ofs_fixup;

    /* seek to the start of the next entry in the central directory... */
    BAIL_IF_ERRPASS(!io->seek(io, si64 + extralen + commentlen), NULL);

    return retval;  /* success. */
}